

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeArrayBufferConstructor
               (DynamicObject *arrayBufferConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Var value;
  JavascriptLibrary *pJVar1;
  DynamicObject **ppDVar2;
  PropertyString *value_00;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *arrayBufferConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayBufferConstructor,mode,4,0);
  this = RecyclableObject::GetScriptContext(&arrayBufferConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&arrayBufferConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,arrayBufferConstructor,0xd1,value,'\x02');
  pJVar1 = ScriptContext::GetLibrary(this);
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)
                       &(pJVar1->super_JavascriptLibraryBase).arrayBufferPrototype);
  AddMember(this_00,arrayBufferConstructor,0x124,*ppDVar2,'\0');
  AddSpeciesAccessorsToLibraryObject
            (this_00,arrayBufferConstructor,
             (FunctionInfo *)ArrayBuffer::EntryInfo::GetterSymbolSpecies);
  value_00 = ScriptContext::GetPropertyString(this,0x1ac);
  AddMember(this_00,arrayBufferConstructor,0x106,value_00,'\x02');
  AddFunctionToLibraryObject
            (this_00,arrayBufferConstructor,200,(FunctionInfo *)ArrayBuffer::EntryInfo::IsView,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,arrayBufferConstructor,0x73,(FunctionInfo *)ArrayBuffer::EntryInfo::Detach,1,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(arrayBufferConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayBufferConstructor(DynamicObject* arrayBufferConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayBufferConstructor, mode, 4);

        ScriptContext* scriptContext = arrayBufferConstructor->GetScriptContext();
        JavascriptLibrary* library = arrayBufferConstructor->GetLibrary();
        library->AddMember(arrayBufferConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(arrayBufferConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->arrayBufferPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(arrayBufferConstructor, &ArrayBuffer::EntryInfo::GetterSymbolSpecies);
        library->AddMember(arrayBufferConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::ArrayBuffer), PropertyConfigurable);

        library->AddFunctionToLibraryObject(arrayBufferConstructor, PropertyIds::isView, &ArrayBuffer::EntryInfo::IsView, 1);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        library->AddFunctionToLibraryObject(arrayBufferConstructor, PropertyIds::detach, &ArrayBuffer::EntryInfo::Detach, 1);
#endif
        arrayBufferConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }